

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_util.cpp
# Opt level: O2

BanMan * EnsureBanman(NodeContext *node)

{
  BanMan *pBVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar1 = (node->banman)._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
           super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
           super__Head_base<0UL,_BanMan_*,_false>._M_head_impl;
  if (pBVar1 == (BanMan *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Error: Ban database not loaded",&local_41);
    JSONRPCError(__return_storage_ptr__,-0x14,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pBVar1;
  }
  __stack_chk_fail();
}

Assistant:

BanMan& EnsureBanman(const NodeContext& node)
{
    if (!node.banman) {
        throw JSONRPCError(RPC_DATABASE_ERROR, "Error: Ban database not loaded");
    }
    return *node.banman;
}